

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU.h
# Opt level: O2

void __thiscall
Eigen::
SparseLUMatrixUReturnType<Eigen::internal::MappedSuperNodalMatrix<double,int>,Eigen::MappedSparseMatrix<double,0,int>>
::solveInPlace<Eigen::Matrix<double,_1,3,0,_1,3>>
          (SparseLUMatrixUReturnType<Eigen::internal::MappedSuperNodalMatrix<double,int>,Eigen::MappedSparseMatrix<double,0,int>>
           *this,MatrixBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *X)

{
  undefined1 *this_00;
  undefined1 *dst;
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Scalar *pSVar6;
  long lVar7;
  uint uVar8;
  Index j;
  long lVar9;
  long lVar10;
  long lVar11;
  long row;
  long lVar12;
  PointerType local_128;
  PointerType pdStack_120;
  long local_118;
  long lStack_110;
  undefined1 auStack_f8 [8];
  Map<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> A;
  Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> U;
  
  iVar3 = *(int *)(X + 8);
  for (uVar8 = *(uint *)(*(long *)this + 8); -1 < (int)uVar8; uVar8 = uVar8 - 1) {
    lVar11 = *(long *)this;
    row = (long)*(int *)(*(long *)(lVar11 + 0x38) + (ulong)uVar8 * 4);
    lVar12 = (long)*(int *)(*(long *)(lVar11 + 0x18) + row * 4);
    lVar9 = (long)*(int *)(*(long *)(lVar11 + 0x38) + 4 + (ulong)uVar8 * 4);
    lVar10 = lVar9 - row;
    if ((int)lVar10 == 1) {
      for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
        dVar1 = *(double *)(*(long *)(*(long *)this + 0x10) + lVar12 * 8);
        pSVar6 = DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1> *)X,row,
                            lVar11);
        *pSVar6 = *pSVar6 / dVar1;
      }
    }
    else {
      lVar7 = *(long *)(lVar11 + 0x10);
      this_00 = &U.m_stride.super_Stride<_1,_0>.field_0x8;
      OuterStride<-1>::OuterStride
                ((OuterStride<_1> *)this_00,
                 *(int *)(*(long *)(lVar11 + 0x18) + 4 + row * 4) - lVar12);
      MapBase<Eigen::Map<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
      ::MapBase((MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 *)auStack_f8,(PointerType)(lVar12 * 8 + lVar7),lVar10,lVar10);
      A.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value = U.m_stride.super_Stride<_1,_0>._8_8_;
      pSVar6 = DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1> *)X,row,0);
      OuterStride<-1>::OuterStride((OuterStride<_1> *)this_00,(long)iVar3);
      dst = &A.m_stride.super_Stride<_1,_0>.field_0x8;
      MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>::
      MapBase((MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               *)dst,pSVar6,lVar10,3);
      U.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value = U.m_stride.super_Stride<_1,_0>._8_8_;
      local_128 = (PointerType)auStack_f8;
      pdStack_120 = A.
                    super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                    .m_data;
      local_118 = A.
                  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_rows.m_value;
      lStack_110 = A.
                   super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                   .m_cols.m_value;
      U.m_stride.super_Stride<_1,_0>._8_8_ = &local_128;
      internal::
      triangular_solve_retval<1,Eigen::TriangularView<Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>,2u>,Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>>
      ::evalTo<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>>
                ((triangular_solve_retval<1,Eigen::TriangularView<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>>,2u>,Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>>
                  *)this_00,
                 (Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)dst);
    }
    for (lVar11 = 0; lVar10 = row, lVar11 != 3; lVar11 = lVar11 + 1) {
      for (; lVar10 < lVar9; lVar10 = lVar10 + 1) {
        lVar12 = *(long *)(this + 8);
        iVar4 = *(int *)(*(long *)(lVar12 + 0x10) + 4 + lVar10 * 4);
        for (lVar7 = (long)*(int *)(*(long *)(lVar12 + 0x10) + lVar10 * 4); lVar7 < iVar4;
            lVar7 = lVar7 + 1) {
          iVar5 = *(int *)(*(long *)(lVar12 + 0x18) + lVar7 * 4);
          pSVar6 = DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1> *)X,lVar10
                              ,lVar11);
          dVar1 = *pSVar6;
          dVar2 = *(double *)(*(long *)(lVar12 + 0x20) + lVar7 * 8);
          pSVar6 = DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1> *)X,
                              (long)iVar5,lVar11);
          *pSVar6 = *pSVar6 - dVar1 * dVar2;
        }
      }
    }
  }
  return;
}

Assistant:

void solveInPlace(MatrixBase<Dest> &X) const
  {
    Index nrhs = X.cols();
    Index n = X.rows();
    // Backward solve with U
    for (Index k = m_mapL.nsuper(); k >= 0; k--)
    {
      Index fsupc = m_mapL.supToCol()[k];
      Index lda = m_mapL.colIndexPtr()[fsupc+1] - m_mapL.colIndexPtr()[fsupc]; // leading dimension
      Index nsupc = m_mapL.supToCol()[k+1] - fsupc;
      Index luptr = m_mapL.colIndexPtr()[fsupc];

      if (nsupc == 1)
      {
        for (Index j = 0; j < nrhs; j++)
        {
          X(fsupc, j) /= m_mapL.valuePtr()[luptr];
        }
      }
      else
      {
        Map<const Matrix<Scalar,Dynamic,Dynamic>, 0, OuterStride<> > A( &(m_mapL.valuePtr()[luptr]), nsupc, nsupc, OuterStride<>(lda) );
        Map< Matrix<Scalar,Dynamic,Dynamic>, 0, OuterStride<> > U (&(X(fsupc,0)), nsupc, nrhs, OuterStride<>(n) );
        U = A.template triangularView<Upper>().solve(U);
      }

      for (Index j = 0; j < nrhs; ++j)
      {
        for (Index jcol = fsupc; jcol < fsupc + nsupc; jcol++)
        {
          typename MatrixUType::InnerIterator it(m_mapU, jcol);
          for ( ; it; ++it)
          {
            Index irow = it.index();
            X(irow, j) -= X(jcol, j) * it.value();
          }
        }
      }
    } // End For U-solve
  }